

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.cpp
# Opt level: O0

void __thiscall Diligent::SRBMemoryAllocator::~SRBMemoryAllocator(SRBMemoryAllocator *this)

{
  Uint32 UVar1;
  Uint32 UVar2;
  uint local_18;
  Uint32 s;
  Uint32 TotalAllocatorCount;
  SRBMemoryAllocator *this_local;
  
  if (this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) {
    UVar1 = this->m_ShaderVariableDataAllocatorCount;
    UVar2 = this->m_ResourceCacheDataAllocatorCount;
    for (local_18 = 0; local_18 < UVar1 + UVar2; local_18 = local_18 + 1) {
      FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(this->m_DataAllocators + local_18);
    }
    (*this->m_RawMemAllocator->_vptr_IMemoryAllocator[1])
              (this->m_RawMemAllocator,this->m_DataAllocators);
  }
  return;
}

Assistant:

SRBMemoryAllocator::~SRBMemoryAllocator()
{
    if (m_DataAllocators != nullptr)
    {
        auto TotalAllocatorCount = m_ShaderVariableDataAllocatorCount + m_ResourceCacheDataAllocatorCount;
        for (Uint32 s = 0; s < TotalAllocatorCount; ++s)
        {
            m_DataAllocators[s].~FixedBlockMemoryAllocator();
        }
        m_RawMemAllocator.Free(m_DataAllocators);
    }
}